

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
sort_fn<std::greater<void>>::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          sort_fn<std::greater<void>> *this,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  iterator iVar1;
  iterator iVar2;
  vector<signed_char,_std::allocator<signed_char>_> *c_local;
  sort_fn<std::greater<void>_> *this_local;
  
  iVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::begin(c);
  iVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::end(c);
  std::
  sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,std::greater<void>>
            (iVar1._M_current,iVar2._M_current);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end(), compare);
        return c;
    }